

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O2

void __thiscall disp::test(disp *this)

{
  string *__lhs;
  bool bVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  allocator local_d30 [32];
  ostringstream oss;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b90;
  string local_b88 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b60;
  string local_b58 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b30;
  string local_b28 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b00;
  string local_af8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ad0;
  string local_ac8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_aa0;
  string local_a98 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a70;
  string local_a68 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a40;
  string local_a38 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a10;
  string local_a08 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9e0;
  string local_9d8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9b0;
  string local_9a8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_980;
  string local_978 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_950;
  string local_948 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_920;
  string local_918 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8f0;
  string local_8e8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8c0;
  string local_8b8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_890;
  string local_888 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_860;
  string local_858 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_830;
  string local_828 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_800;
  string local_7f8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7d0;
  string local_7c8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7a0;
  string local_798 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_770;
  string local_768 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_740;
  string local_738 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_710;
  string local_708 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6e0;
  string local_6d8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6b0;
  string local_6a8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_680;
  string local_678 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_650;
  string local_648 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_620;
  string local_618 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5f0;
  string local_5e8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5c0;
  string local_5b8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_590;
  string local_588 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_560;
  string local_558 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_530;
  string local_528 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_500;
  string local_4f8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4d0;
  string local_4c8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a0;
  string local_498 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_470;
  string local_468 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_440;
  string local_438 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_410;
  string local_408 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e0;
  string local_3d8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b0;
  string local_3a8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_380;
  string local_378 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_350;
  string local_348 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_320;
  string local_318 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2f0;
  string local_2e8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c0;
  string local_2b8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_290;
  string local_288 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_260;
  string local_258 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_230;
  string local_228 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_200;
  string local_1f8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  string local_1c8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  string local_198 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  string local_168 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,"hg/x",(allocator *)&oss);
  (**(code **)(*(long *)this + 0x10))(this,local_38);
  std::__cxx11::string::~string(local_38);
  __lhs = &this->v_;
  bVar1 = std::operator==(__lhs,"m:hg/x:x");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xe2);
    std::operator<<(poVar2," v_==\"m:hg/x:x\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_d30);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string(local_58,"h0",(allocator *)&oss);
  (**(code **)(*(long *)this + 0x10))(this,local_58);
  std::__cxx11::string::~string(local_58);
  bVar1 = std::operator==(__lhs,"-");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xe3);
    std::operator<<(poVar2," v_==\"-\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_d30);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string(local_78,"h1/a1",(allocator *)&oss);
  (**(code **)(*(long *)this + 0x10))(this,local_78);
  std::__cxx11::string::~string(local_78);
  bVar1 = std::operator==(__lhs,":1");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xe4);
    std::operator<<(poVar2," v_==\":1\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_d30);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string(local_98,"h2/a1/a2",(allocator *)&oss);
  (**(code **)(*(long *)this + 0x10))(this,local_98);
  std::__cxx11::string::~string(local_98);
  bVar1 = std::operator==(__lhs,":1:2");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xe5);
    std::operator<<(poVar2," v_==\":1:2\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_d30);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string(local_b8,"h3/a1/a2/a3",(allocator *)&oss);
  (**(code **)(*(long *)this + 0x10))(this,local_b8);
  std::__cxx11::string::~string(local_b8);
  bVar1 = std::operator==(__lhs,":1:2:3");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xe6);
    std::operator<<(poVar2," v_==\":1:2:3\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_d30);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string(local_d8,"h4/a1/a2/a3/a4",(allocator *)&oss);
  (**(code **)(*(long *)this + 0x10))(this,local_d8);
  std::__cxx11::string::~string(local_d8);
  bVar1 = std::operator==(__lhs,":1:2:3:4");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xe7);
    std::operator<<(poVar2," v_==\":1:2:3:4\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_d30);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string(local_f8,"h5/a1/a2/a3/a4/a5",(allocator *)&oss);
  (**(code **)(*(long *)this + 0x10))(this,local_f8);
  std::__cxx11::string::~string(local_f8);
  bVar1 = std::operator==(__lhs,":1:2:3:4:5");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xe8);
    std::operator<<(poVar2," v_==\":1:2:3:4:5\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_d30);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string(local_118,"h6/a1/a2/a3/a4/a5/a6",(allocator *)&oss);
  (**(code **)(*(long *)this + 0x10))(this,local_118);
  std::__cxx11::string::~string(local_118);
  bVar1 = std::operator==(__lhs,":1:2:3:4:5:6");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xe9);
    std::operator<<(poVar2," v_==\":1:2:3:4:5:6\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_d30);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::assign((char *)__lhs);
  std::__cxx11::string::string((string *)&oss,"GET",local_d30);
  set_context(this,(string *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::string(local_138,"/h0",(allocator *)&oss);
  (**(code **)(*(long *)this + 0x10))(this,local_138);
  std::__cxx11::string::~string(local_138);
  cppcms::application::release_context();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140);
  bVar1 = std::operator!=(__lhs,"-");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)__lhs);
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"-");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  bVar1 = std::operator==(__lhs,"-");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xec);
    std::operator<<(poVar2," v_==(\"-\")");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_d30);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::assign((char *)__lhs);
  std::__cxx11::string::string((string *)&oss,"GET",local_d30);
  set_context(this,(string *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::string(local_168,"/rh0",(allocator *)&oss);
  (**(code **)(*(long *)this + 0x10))(this,local_168);
  std::__cxx11::string::~string(local_168);
  cppcms::application::release_context();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170);
  bVar1 = std::operator!=(__lhs,"-");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)__lhs);
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"-");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  bVar1 = std::operator==(__lhs,"-");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xed);
    std::operator<<(poVar2," v_==(\"-\")");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_d30);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::assign((char *)__lhs);
  std::__cxx11::string::string((string *)&oss,"GET",local_d30);
  set_context(this,(string *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::string(local_198,"/RH0",(allocator *)&oss);
  (**(code **)(*(long *)this + 0x10))(this,local_198);
  std::__cxx11::string::~string(local_198);
  cppcms::application::release_context();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a0);
  bVar1 = std::operator!=(__lhs,"-");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)__lhs);
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"-");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  bVar1 = std::operator==(__lhs,"-");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xee);
    std::operator<<(poVar2," v_==(\"-\")");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_d30);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::assign((char *)__lhs);
  std::__cxx11::string::string((string *)&oss,"GET",local_d30);
  set_context(this,(string *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::string(local_1c8,"/h1_num/123.3",(allocator *)&oss);
  (**(code **)(*(long *)this + 0x10))(this,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  cppcms::application::release_context();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d0);
  bVar1 = std::operator!=(__lhs,"h1_d:to_str(123.3)");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)__lhs);
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"h1_d:to_str(123.3)");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  bVar1 = std::operator==(__lhs,"h1_d:to_str(123.3)");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xef);
    std::operator<<(poVar2," v_==(\"h1_d:to_str(123.3)\")");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_d30);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::assign((char *)__lhs);
  std::__cxx11::string::string((string *)&oss,"GET",local_d30);
  set_context(this,(string *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::string(local_1f8,"/h1_num/123",(allocator *)&oss);
  (**(code **)(*(long *)this + 0x10))(this,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  cppcms::application::release_context();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_200);
  bVar1 = std::operator!=(__lhs,"h1_i:to_str(123)");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)__lhs);
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"h1_i:to_str(123)");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  bVar1 = std::operator==(__lhs,"h1_i:to_str(123)");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xf0);
    std::operator<<(poVar2," v_==(\"h1_i:to_str(123)\")");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_d30);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::assign((char *)__lhs);
  std::__cxx11::string::string((string *)&oss,"GET",local_d30);
  set_context(this,(string *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::string(local_228,"/h1_num/123 23",(allocator *)&oss);
  (**(code **)(*(long *)this + 0x10))(this,local_228);
  std::__cxx11::string::~string(local_228);
  cppcms::application::release_context();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_230);
  bVar1 = std::operator!=(__lhs,"none");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)__lhs);
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"none");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  bVar1 = std::operator==(__lhs,"none");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xf1);
    std::operator<<(poVar2," v_==(\"none\")");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_d30);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::assign((char *)__lhs);
  std::__cxx11::string::string((string *)&oss,"GET",local_d30);
  set_context(this,(string *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::string(local_258,"/h1_s/1111",(allocator *)&oss);
  (**(code **)(*(long *)this + 0x10))(this,local_258);
  std::__cxx11::string::~string(local_258);
  cppcms::application::release_context();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_260);
  bVar1 = std::operator!=(__lhs,"h1_s:1111");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)__lhs);
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"h1_s:1111");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  bVar1 = std::operator==(__lhs,"h1_s:1111");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xf2);
    std::operator<<(poVar2," v_==(\"h1_s:1111\")");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_d30);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::assign((char *)__lhs);
  std::__cxx11::string::string((string *)&oss,"GET",local_d30);
  set_context(this,(string *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::string(local_288,"/RH1_S/1111",(allocator *)&oss);
  (**(code **)(*(long *)this + 0x10))(this,local_288);
  std::__cxx11::string::~string(local_288);
  cppcms::application::release_context();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_290);
  bVar1 = std::operator!=(__lhs,"h1_s:1111");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)__lhs);
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"h1_s:1111");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  bVar1 = std::operator==(__lhs,"h1_s:1111");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xf3);
    std::operator<<(poVar2," v_==(\"h1_s:1111\")");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_d30);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::assign((char *)__lhs);
  std::__cxx11::string::string((string *)&oss,"GET",local_d30);
  set_context(this,(string *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::string(local_2b8,"/h1_s_c/1111",(allocator *)&oss);
  (**(code **)(*(long *)this + 0x10))(this,local_2b8);
  std::__cxx11::string::~string(local_2b8);
  cppcms::application::release_context();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2c0);
  bVar1 = std::operator!=(__lhs,"h1_s_c:1111");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)__lhs);
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"h1_s_c:1111");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  bVar1 = std::operator==(__lhs,"h1_s_c:1111");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xf4);
    std::operator<<(poVar2," v_==(\"h1_s_c:1111\")");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_d30);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::assign((char *)__lhs);
  std::__cxx11::string::string((string *)&oss,"GET",local_d30);
  set_context(this,(string *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::string(local_2e8,"/h1_s_r/1111",(allocator *)&oss);
  (**(code **)(*(long *)this + 0x10))(this,local_2e8);
  std::__cxx11::string::~string(local_2e8);
  cppcms::application::release_context();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2f0);
  bVar1 = std::operator!=(__lhs,"h1_s_r:1111");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)__lhs);
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"h1_s_r:1111");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  bVar1 = std::operator==(__lhs,"h1_s_r:1111");
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xf5);
    std::operator<<(poVar2," v_==(\"h1_s_r:1111\")");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_d30);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::assign((char *)__lhs);
  std::__cxx11::string::string((string *)&oss,"GET",local_d30);
  set_context(this,(string *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::string(local_318,"/h1_s_cr/1111",(allocator *)&oss);
  (**(code **)(*(long *)this + 0x10))(this,local_318);
  std::__cxx11::string::~string(local_318);
  cppcms::application::release_context();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_320);
  bVar1 = std::operator!=(__lhs,"h1_s_cr:1111");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)__lhs);
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"h1_s_cr:1111");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  bVar1 = std::operator==(__lhs,"h1_s_cr:1111");
  if (bVar1) {
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_348,anon_var_dwarf_cf06,(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_348);
    std::__cxx11::string::~string(local_348);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_350);
    bVar1 = std::operator!=(__lhs,"none");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"none");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"none");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xf7);
      std::operator<<(poVar2," v_==(\"none\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_378,anon_var_dwarf_cf06,(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_378);
    std::__cxx11::string::~string(local_378);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_380);
    bVar1 = std::operator!=(__lhs,"none");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"none");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"none");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xf8);
      std::operator<<(poVar2," v_==(\"none\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_3a8,anon_var_dwarf_cf12,(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_3a8);
    std::__cxx11::string::~string(local_3a8);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3b0);
    bVar1 = std::operator!=(__lhs,anon_var_dwarf_cf1e);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,anon_var_dwarf_cf1e);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,anon_var_dwarf_cf1e);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xfb);
      std::operator<<(poVar2,
                      " v_==(\"h1_s:\\xD7\\xA9\\xD7\\x9C\\xD7\\x95\\xD7\\x9D\\x20\\xE6\\x97\\xA5\\xE6\\x9C\\xAC\\xE8\\xAA\\x9E\")"
                     );
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_3d8,anon_var_dwarf_cf44,(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_3d8);
    std::__cxx11::string::~string(local_3d8);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3e0);
    bVar1 = std::operator!=(__lhs,"none");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"none");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"none");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xfc);
      std::operator<<(poVar2," v_==(\"none\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_408,"/res",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_408);
    std::__cxx11::string::~string(local_408);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_410);
    bVar1 = std::operator!=(__lhs,"get_0");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_0");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"get_0");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xfe);
      std::operator<<(poVar2," v_==(\"get_0\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_438,"/res/a1",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_438);
    std::__cxx11::string::~string(local_438);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_440);
    bVar1 = std::operator!=(__lhs,"get_1:to_str(1)");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_1:to_str(1)");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"get_1:to_str(1)");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xff);
      std::operator<<(poVar2," v_==(\"get_1:to_str(1)\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_468,"/res/a1/a2",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_468);
    std::__cxx11::string::~string(local_468);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_470);
    bVar1 = std::operator!=(__lhs,"get_2:to_str(1):to_str(2)");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_2:to_str(1):to_str(2)");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"get_2:to_str(1):to_str(2)");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x100);
      std::operator<<(poVar2," v_==(\"get_2:to_str(1):to_str(2)\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"POST",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_498,"/res",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_498);
    std::__cxx11::string::~string(local_498);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4a0);
    bVar1 = std::operator!=(__lhs,"p_0");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"p_0");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"p_0");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x102);
      std::operator<<(poVar2," v_==(\"p_0\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"POST",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_4c8,"/res/a1",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_4c8);
    std::__cxx11::string::~string(local_4c8);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4d0);
    bVar1 = std::operator!=(__lhs,"p_1:to_str(1)");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"p_1:to_str(1)");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"p_1:to_str(1)");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x103);
      std::operator<<(poVar2," v_==(\"p_1:to_str(1)\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"POST",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_4f8,"/res/a1/a2",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_4f8);
    std::__cxx11::string::~string(local_4f8);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_500);
    bVar1 = std::operator!=(__lhs,"p_2:to_str(1):to_str(2)");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"p_2:to_str(1):to_str(2)");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"p_2:to_str(1):to_str(2)");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x104);
      std::operator<<(poVar2," v_==(\"p_2:to_str(1):to_str(2)\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"PUT",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_528,"/res",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_528);
    std::__cxx11::string::~string(local_528);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_530);
    bVar1 = std::operator!=(__lhs,"p_0");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"p_0");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"p_0");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x106);
      std::operator<<(poVar2," v_==(\"p_0\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"PUT",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_558,"/res/a1",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_558);
    std::__cxx11::string::~string(local_558);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_560);
    bVar1 = std::operator!=(__lhs,"p_1:to_str(1)");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"p_1:to_str(1)");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"p_1:to_str(1)");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x107);
      std::operator<<(poVar2," v_==(\"p_1:to_str(1)\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"PUT",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_588,"/res/a1/a2",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_588);
    std::__cxx11::string::~string(local_588);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_590);
    bVar1 = std::operator!=(__lhs,"p_2:to_str(1):to_str(2)");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"p_2:to_str(1):to_str(2)");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"p_2:to_str(1):to_str(2)");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x108);
      std::operator<<(poVar2," v_==(\"p_2:to_str(1):to_str(2)\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"DELETE",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_5b8,"/res",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_5b8);
    std::__cxx11::string::~string(local_5b8);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5c0);
    bVar1 = std::operator!=(__lhs,"none");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"none");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"none");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x10a);
      std::operator<<(poVar2," v_==(\"none\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"DELETE",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_5e8,"/res/a1",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_5e8);
    std::__cxx11::string::~string(local_5e8);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5f0);
    bVar1 = std::operator!=(__lhs,"none");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"none");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"none");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x10b);
      std::operator<<(poVar2," v_==(\"none\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"DELETE",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_618,"/res/a1/a2",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_618);
    std::__cxx11::string::~string(local_618);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_620);
    bVar1 = std::operator!=(__lhs,"none");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"none");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"none");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x10c);
      std::operator<<(poVar2," v_==(\"none\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_648,"/point/123,23",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_648);
    std::__cxx11::string::~string(local_648);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_650);
    bVar1 = std::operator!=(__lhs,"point:to_str(123)Xto_str(23)");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"point:to_str(123)Xto_str(23)");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"point:to_str(123)Xto_str(23)");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x10e);
      std::operator<<(poVar2," v_==(\"point:to_str(123)Xto_str(23)\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_678,"/point/123",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_678);
    std::__cxx11::string::~string(local_678);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_680);
    bVar1 = std::operator!=(__lhs,"none");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"none");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"none");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x10f);
      std::operator<<(poVar2," v_==(\"none\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_6a8,"/point/123,23.2",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_6a8);
    std::__cxx11::string::~string(local_6a8);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_6b0);
    bVar1 = std::operator!=(__lhs,"none");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"none");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"none");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x110);
      std::operator<<(poVar2," v_==(\"none\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_6d8,"/foo/abcd",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_6d8);
    std::__cxx11::string::~string(local_6d8);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_6e0);
    bVar1 = std::operator!=(__lhs,"foo:to_str(4)");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"foo:to_str(4)");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"foo:to_str(4)");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x112);
      std::operator<<(poVar2," v_==(\"foo:to_str(4)\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_708,"/foo/abcdefg",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_708);
    std::__cxx11::string::~string(local_708);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_710);
    bVar1 = std::operator!=(__lhs,"foo:to_str(7)");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"foo:to_str(7)");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"foo:to_str(7)");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x113);
      std::operator<<(poVar2," v_==(\"foo:to_str(7)\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_738,"/res_1/a1/a2/a3",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_738);
    std::__cxx11::string::~string(local_738);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_740);
    bVar1 = std::operator!=(__lhs,"get_3:1:2:3");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_3:1:2:3");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"get_3:1:2:3");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x115);
      std::operator<<(poVar2," v_==(\"get_3:1:2:3\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_768,"/res_2/a1/a2/a3",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_768);
    std::__cxx11::string::~string(local_768);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_770);
    bVar1 = std::operator!=(__lhs,"get_3:1:2:3");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_3:1:2:3");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"get_3:1:2:3");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x116);
      std::operator<<(poVar2," v_==(\"get_3:1:2:3\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_798,"/res_3/a1/a2/a3",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_798);
    std::__cxx11::string::~string(local_798);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7a0);
    bVar1 = std::operator!=(__lhs,"get_3:1:2:3");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_3:1:2:3");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"get_3:1:2:3");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x117);
      std::operator<<(poVar2," v_==(\"get_3:1:2:3\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_7c8,"/res_4/a1/a2/a3",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_7c8);
    std::__cxx11::string::~string(local_7c8);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7d0);
    bVar1 = std::operator!=(__lhs,"get_3:1:2:3");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_3:1:2:3");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"get_3:1:2:3");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x118);
      std::operator<<(poVar2," v_==(\"get_3:1:2:3\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_7f8,"/res_1/a1/a2/a3/a4",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_7f8);
    std::__cxx11::string::~string(local_7f8);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_800);
    bVar1 = std::operator!=(__lhs,"get_4:1:2:3:4");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_4:1:2:3:4");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"get_4:1:2:3:4");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x11a);
      std::operator<<(poVar2," v_==(\"get_4:1:2:3:4\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_828,"/res_2/a1/a2/a3/a4",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_828);
    std::__cxx11::string::~string(local_828);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_830);
    bVar1 = std::operator!=(__lhs,"get_4:1:2:3:4");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_4:1:2:3:4");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"get_4:1:2:3:4");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x11b);
      std::operator<<(poVar2," v_==(\"get_4:1:2:3:4\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_858,"/res_3/a1/a2/a3/a4",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_858);
    std::__cxx11::string::~string(local_858);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_860);
    bVar1 = std::operator!=(__lhs,"get_4:1:2:3:4");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_4:1:2:3:4");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"get_4:1:2:3:4");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x11c);
      std::operator<<(poVar2," v_==(\"get_4:1:2:3:4\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_888,"/res_4/a1/a2/a3/a4",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_888);
    std::__cxx11::string::~string(local_888);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_890);
    bVar1 = std::operator!=(__lhs,"get_4:1:2:3:4");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_4:1:2:3:4");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"get_4:1:2:3:4");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x11d);
      std::operator<<(poVar2," v_==(\"get_4:1:2:3:4\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_8b8,"/res_1/a1/a2/a3/a4/a5",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_8b8);
    std::__cxx11::string::~string(local_8b8);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_8c0);
    bVar1 = std::operator!=(__lhs,"get_5:1:2:3:4:5");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_5:1:2:3:4:5");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"get_5:1:2:3:4:5");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x11f);
      std::operator<<(poVar2," v_==(\"get_5:1:2:3:4:5\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_8e8,"/res_2/a1/a2/a3/a4/a5",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_8e8);
    std::__cxx11::string::~string(local_8e8);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_8f0);
    bVar1 = std::operator!=(__lhs,"get_5:1:2:3:4:5");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_5:1:2:3:4:5");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"get_5:1:2:3:4:5");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x120);
      std::operator<<(poVar2," v_==(\"get_5:1:2:3:4:5\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_918,"/res_3/a1/a2/a3/a4/a5",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_918);
    std::__cxx11::string::~string(local_918);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_920);
    bVar1 = std::operator!=(__lhs,"get_5:1:2:3:4:5");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_5:1:2:3:4:5");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"get_5:1:2:3:4:5");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x121);
      std::operator<<(poVar2," v_==(\"get_5:1:2:3:4:5\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_948,"/res_4/a1/a2/a3/a4/a5",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_948);
    std::__cxx11::string::~string(local_948);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_950);
    bVar1 = std::operator!=(__lhs,"get_5:1:2:3:4:5");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_5:1:2:3:4:5");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"get_5:1:2:3:4:5");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x122);
      std::operator<<(poVar2," v_==(\"get_5:1:2:3:4:5\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_978,"/res_1/a1/a2/a3/a4/a5/a6",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_978);
    std::__cxx11::string::~string(local_978);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_980);
    bVar1 = std::operator!=(__lhs,"get_6:1:2:3:4:5:6");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_6:1:2:3:4:5:6");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"get_6:1:2:3:4:5:6");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x124);
      std::operator<<(poVar2," v_==(\"get_6:1:2:3:4:5:6\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_9a8,"/res_2/a1/a2/a3/a4/a5/a6",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_9a8);
    std::__cxx11::string::~string(local_9a8);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_9b0);
    bVar1 = std::operator!=(__lhs,"get_6:1:2:3:4:5:6");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_6:1:2:3:4:5:6");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"get_6:1:2:3:4:5:6");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x125);
      std::operator<<(poVar2," v_==(\"get_6:1:2:3:4:5:6\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__lhs);
    std::__cxx11::string::string((string *)&oss,"GET",local_d30);
    set_context(this,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::string(local_9d8,"/res_3/a1/a2/a3/a4/a5/a6",(allocator *)&oss);
    (**(code **)(*(long *)this + 0x10))(this,local_9d8);
    std::__cxx11::string::~string(local_9d8);
    cppcms::application::release_context();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_9e0);
    bVar1 = std::operator!=(__lhs,"get_6:1:2:3:4:5:6");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_6:1:2:3:4:5:6");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = std::operator==(__lhs,"get_6:1:2:3:4:5:6");
    if (bVar1) {
      std::__cxx11::string::assign((char *)__lhs);
      std::__cxx11::string::string((string *)&oss,"GET",local_d30);
      set_context(this,(string *)&oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::string(local_a08,"/res_4/a1/a2/a3/a4/a5/a6",(allocator *)&oss);
      (**(code **)(*(long *)this + 0x10))(this,local_a08);
      std::__cxx11::string::~string(local_a08);
      cppcms::application::release_context();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a10);
      bVar1 = std::operator!=(__lhs,"get_6:1:2:3:4:5:6");
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
        poVar2 = std::operator<<(poVar2,(string *)__lhs);
        poVar2 = std::operator<<(poVar2," exp=");
        poVar2 = std::operator<<(poVar2,"get_6:1:2:3:4:5:6");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      bVar1 = std::operator==(__lhs,"get_6:1:2:3:4:5:6");
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar2 = std::operator<<((ostream *)&oss,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x127);
        std::operator<<(poVar2," v_==(\"get_6:1:2:3:4:5:6\")");
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar3,(string *)local_d30);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::assign((char *)__lhs);
      std::__cxx11::string::string((string *)&oss,"GET",local_d30);
      set_context(this,(string *)&oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::string(local_a38,"/res_1/a1/a2/a3/a4/a5/a6/a7",(allocator *)&oss);
      (**(code **)(*(long *)this + 0x10))(this,local_a38);
      std::__cxx11::string::~string(local_a38);
      cppcms::application::release_context();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a40);
      bVar1 = std::operator!=(__lhs,"get_7:1:2:3:4:5:6:7");
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
        poVar2 = std::operator<<(poVar2,(string *)__lhs);
        poVar2 = std::operator<<(poVar2," exp=");
        poVar2 = std::operator<<(poVar2,"get_7:1:2:3:4:5:6:7");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      bVar1 = std::operator==(__lhs,"get_7:1:2:3:4:5:6:7");
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar2 = std::operator<<((ostream *)&oss,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x129);
        std::operator<<(poVar2," v_==(\"get_7:1:2:3:4:5:6:7\")");
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar3,(string *)local_d30);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::assign((char *)__lhs);
      std::__cxx11::string::string((string *)&oss,"GET",local_d30);
      set_context(this,(string *)&oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::string(local_a68,"/res_2/a1/a2/a3/a4/a5/a6/a7",(allocator *)&oss);
      (**(code **)(*(long *)this + 0x10))(this,local_a68);
      std::__cxx11::string::~string(local_a68);
      cppcms::application::release_context();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a70);
      bVar1 = std::operator!=(__lhs,"get_7:1:2:3:4:5:6:7");
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
        poVar2 = std::operator<<(poVar2,(string *)__lhs);
        poVar2 = std::operator<<(poVar2," exp=");
        poVar2 = std::operator<<(poVar2,"get_7:1:2:3:4:5:6:7");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      bVar1 = std::operator==(__lhs,"get_7:1:2:3:4:5:6:7");
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar2 = std::operator<<((ostream *)&oss,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x12a);
        std::operator<<(poVar2," v_==(\"get_7:1:2:3:4:5:6:7\")");
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar3,(string *)local_d30);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::assign((char *)__lhs);
      std::__cxx11::string::string((string *)&oss,"GET",local_d30);
      set_context(this,(string *)&oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::string(local_a98,"/res_3/a1/a2/a3/a4/a5/a6/a7",(allocator *)&oss);
      (**(code **)(*(long *)this + 0x10))(this,local_a98);
      std::__cxx11::string::~string(local_a98);
      cppcms::application::release_context();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_aa0);
      bVar1 = std::operator!=(__lhs,"get_7:1:2:3:4:5:6:7");
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
        poVar2 = std::operator<<(poVar2,(string *)__lhs);
        poVar2 = std::operator<<(poVar2," exp=");
        poVar2 = std::operator<<(poVar2,"get_7:1:2:3:4:5:6:7");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      bVar1 = std::operator==(__lhs,"get_7:1:2:3:4:5:6:7");
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar2 = std::operator<<((ostream *)&oss,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,299);
        std::operator<<(poVar2," v_==(\"get_7:1:2:3:4:5:6:7\")");
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar3,(string *)local_d30);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::assign((char *)__lhs);
      std::__cxx11::string::string((string *)&oss,"GET",local_d30);
      set_context(this,(string *)&oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::string(local_ac8,"/res_4/a1/a2/a3/a4/a5/a6/a7",(allocator *)&oss);
      (**(code **)(*(long *)this + 0x10))(this,local_ac8);
      std::__cxx11::string::~string(local_ac8);
      cppcms::application::release_context();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_ad0);
      bVar1 = std::operator!=(__lhs,"get_7:1:2:3:4:5:6:7");
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
        poVar2 = std::operator<<(poVar2,(string *)__lhs);
        poVar2 = std::operator<<(poVar2," exp=");
        poVar2 = std::operator<<(poVar2,"get_7:1:2:3:4:5:6:7");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      bVar1 = std::operator==(__lhs,"get_7:1:2:3:4:5:6:7");
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar2 = std::operator<<((ostream *)&oss,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,300);
        std::operator<<(poVar2," v_==(\"get_7:1:2:3:4:5:6:7\")");
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar3,(string *)local_d30);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::assign((char *)__lhs);
      std::__cxx11::string::string((string *)&oss,"GET",local_d30);
      set_context(this,(string *)&oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::string(local_af8,"/res_1/a1/a2/a3/a4/a5/a6/a7/a8",(allocator *)&oss);
      (**(code **)(*(long *)this + 0x10))(this,local_af8);
      std::__cxx11::string::~string(local_af8);
      cppcms::application::release_context();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b00);
      bVar1 = std::operator!=(__lhs,"get_8:1:2:3:4:5:6:7:8");
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
        poVar2 = std::operator<<(poVar2,(string *)__lhs);
        poVar2 = std::operator<<(poVar2," exp=");
        poVar2 = std::operator<<(poVar2,"get_8:1:2:3:4:5:6:7:8");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      bVar1 = std::operator==(__lhs,"get_8:1:2:3:4:5:6:7:8");
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar2 = std::operator<<((ostream *)&oss,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x12e);
        std::operator<<(poVar2," v_==(\"get_8:1:2:3:4:5:6:7:8\")");
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar3,(string *)local_d30);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::assign((char *)__lhs);
      std::__cxx11::string::string((string *)&oss,"GET",local_d30);
      set_context(this,(string *)&oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::string(local_b28,"/res_2/a1/a2/a3/a4/a5/a6/a7/a8",(allocator *)&oss);
      (**(code **)(*(long *)this + 0x10))(this,local_b28);
      std::__cxx11::string::~string(local_b28);
      cppcms::application::release_context();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b30);
      bVar1 = std::operator!=(__lhs,"get_8:1:2:3:4:5:6:7:8");
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
        poVar2 = std::operator<<(poVar2,(string *)__lhs);
        poVar2 = std::operator<<(poVar2," exp=");
        poVar2 = std::operator<<(poVar2,"get_8:1:2:3:4:5:6:7:8");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      bVar1 = std::operator==(__lhs,"get_8:1:2:3:4:5:6:7:8");
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar2 = std::operator<<((ostream *)&oss,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x12f);
        std::operator<<(poVar2," v_==(\"get_8:1:2:3:4:5:6:7:8\")");
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar3,(string *)local_d30);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::assign((char *)__lhs);
      std::__cxx11::string::string((string *)&oss,"GET",local_d30);
      set_context(this,(string *)&oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::string(local_b58,"/res_3/a1/a2/a3/a4/a5/a6/a7/a8",(allocator *)&oss);
      (**(code **)(*(long *)this + 0x10))(this,local_b58);
      std::__cxx11::string::~string(local_b58);
      cppcms::application::release_context();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b60);
      bVar1 = std::operator!=(__lhs,"get_8:1:2:3:4:5:6:7:8");
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
        poVar2 = std::operator<<(poVar2,(string *)__lhs);
        poVar2 = std::operator<<(poVar2," exp=");
        poVar2 = std::operator<<(poVar2,"get_8:1:2:3:4:5:6:7:8");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      bVar1 = std::operator==(__lhs,"get_8:1:2:3:4:5:6:7:8");
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar2 = std::operator<<((ostream *)&oss,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x130);
        std::operator<<(poVar2," v_==(\"get_8:1:2:3:4:5:6:7:8\")");
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar3,(string *)local_d30);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::assign((char *)__lhs);
      std::__cxx11::string::string((string *)&oss,"GET",local_d30);
      set_context(this,(string *)&oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::string(local_b88,"/res_4/a1/a2/a3/a4/a5/a6/a7/a8",(allocator *)&oss);
      (**(code **)(*(long *)this + 0x10))(this,local_b88);
      std::__cxx11::string::~string(local_b88);
      cppcms::application::release_context();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b90);
      bVar1 = std::operator!=(__lhs,"get_8:1:2:3:4:5:6:7:8");
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
        poVar2 = std::operator<<(poVar2,(string *)__lhs);
        poVar2 = std::operator<<(poVar2," exp=");
        poVar2 = std::operator<<(poVar2,"get_8:1:2:3:4:5:6:7:8");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      bVar1 = std::operator==(__lhs,"get_8:1:2:3:4:5:6:7:8");
      if (bVar1) {
        return;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x131);
      std::operator<<(poVar2," v_==(\"get_8:1:2:3:4:5:6:7:8\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_d30);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x126);
    std::operator<<(poVar2," v_==(\"get_6:1:2:3:4:5:6\")");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_d30);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xf6);
  std::operator<<(poVar2," v_==(\"h1_s_cr:1111\")");
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar3,(string *)local_d30);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test()
	{
		TESTD("hg/x","m:hg/x:x");
		TESTD("h0","-");
		TESTD("h1/a1",":1");
		TESTD("h2/a1/a2",":1:2");
		TESTD("h3/a1/a2/a3",":1:2:3");
		TESTD("h4/a1/a2/a3/a4",":1:2:3:4");
		TESTD("h5/a1/a2/a3/a4/a5",":1:2:3:4:5");
		TESTD("h6/a1/a2/a3/a4/a5/a6",":1:2:3:4:5:6");


		TESTM("GET","/h0","-");
		TESTM("GET","/rh0","-");
		TESTM("GET","/RH0","-");
		TESTM("GET","/h1_num/123.3","h1_d:to_str(123.3)");
		TESTM("GET","/h1_num/123","h1_i:to_str(123)");
		TESTM("GET","/h1_num/123 23","none");
		TESTM("GET","/h1_s/1111","h1_s:1111");
		TESTM("GET","/RH1_S/1111","h1_s:1111");
		TESTM("GET","/h1_s_c/1111","h1_s_c:1111");
		TESTM("GET","/h1_s_r/1111","h1_s_r:1111");
		TESTM("GET","/h1_s_cr/1111","h1_s_cr:1111");
		TESTM("GET","/h1_s_cr/1111\xFF","none");
		TESTM("GET","/h1_s_cr/1111\xFF","none");
		
		TESTM("GET","/name/\xD7\xA9\xD7\x9C\xD7\x95\xD7\x9D\x20\xE6\x97\xA5\xE6\x9C\xAC\xE8\xAA\x9E",
			   "h1_s:\xD7\xA9\xD7\x9C\xD7\x95\xD7\x9D\x20\xE6\x97\xA5\xE6\x9C\xAC\xE8\xAA\x9E");
		TESTM("GET","/name/\xFF","none");

		TESTM("GET","/res","get_0");
		TESTM("GET","/res/a1","get_1:to_str(1)");
		TESTM("GET","/res/a1/a2","get_2:to_str(1):to_str(2)");
		
		TESTM("POST","/res","p_0");
		TESTM("POST","/res/a1","p_1:to_str(1)");
		TESTM("POST","/res/a1/a2","p_2:to_str(1):to_str(2)");

		TESTM("PUT","/res","p_0");
		TESTM("PUT","/res/a1","p_1:to_str(1)");
		TESTM("PUT","/res/a1/a2","p_2:to_str(1):to_str(2)");

		TESTM("DELETE","/res","none");
		TESTM("DELETE","/res/a1","none");
		TESTM("DELETE","/res/a1/a2","none");

		TESTM("GET","/point/123,23","point:to_str(123)Xto_str(23)");
		TESTM("GET","/point/123","none");
		TESTM("GET","/point/123,23.2","none");

		TESTM("GET","/foo/abcd","foo:to_str(4)");
		TESTM("GET","/foo/abcdefg","foo:to_str(7)");
		
		TESTM("GET","/res_1/a1/a2/a3","get_3:1:2:3");
		TESTM("GET","/res_2/a1/a2/a3","get_3:1:2:3");
		TESTM("GET","/res_3/a1/a2/a3","get_3:1:2:3");
		TESTM("GET","/res_4/a1/a2/a3","get_3:1:2:3");
		
		TESTM("GET","/res_1/a1/a2/a3/a4","get_4:1:2:3:4");
		TESTM("GET","/res_2/a1/a2/a3/a4","get_4:1:2:3:4");
		TESTM("GET","/res_3/a1/a2/a3/a4","get_4:1:2:3:4");
		TESTM("GET","/res_4/a1/a2/a3/a4","get_4:1:2:3:4");
		
		TESTM("GET","/res_1/a1/a2/a3/a4/a5","get_5:1:2:3:4:5");
		TESTM("GET","/res_2/a1/a2/a3/a4/a5","get_5:1:2:3:4:5");
		TESTM("GET","/res_3/a1/a2/a3/a4/a5","get_5:1:2:3:4:5");
		TESTM("GET","/res_4/a1/a2/a3/a4/a5","get_5:1:2:3:4:5");

		TESTM("GET","/res_1/a1/a2/a3/a4/a5/a6","get_6:1:2:3:4:5:6");
		TESTM("GET","/res_2/a1/a2/a3/a4/a5/a6","get_6:1:2:3:4:5:6");
		TESTM("GET","/res_3/a1/a2/a3/a4/a5/a6","get_6:1:2:3:4:5:6");
		TESTM("GET","/res_4/a1/a2/a3/a4/a5/a6","get_6:1:2:3:4:5:6");
		
		TESTM("GET","/res_1/a1/a2/a3/a4/a5/a6/a7","get_7:1:2:3:4:5:6:7");
		TESTM("GET","/res_2/a1/a2/a3/a4/a5/a6/a7","get_7:1:2:3:4:5:6:7");
		TESTM("GET","/res_3/a1/a2/a3/a4/a5/a6/a7","get_7:1:2:3:4:5:6:7");
		TESTM("GET","/res_4/a1/a2/a3/a4/a5/a6/a7","get_7:1:2:3:4:5:6:7");

		TESTM("GET","/res_1/a1/a2/a3/a4/a5/a6/a7/a8","get_8:1:2:3:4:5:6:7:8");
		TESTM("GET","/res_2/a1/a2/a3/a4/a5/a6/a7/a8","get_8:1:2:3:4:5:6:7:8");
		TESTM("GET","/res_3/a1/a2/a3/a4/a5/a6/a7/a8","get_8:1:2:3:4:5:6:7:8");
		TESTM("GET","/res_4/a1/a2/a3/a4/a5/a6/a7/a8","get_8:1:2:3:4:5:6:7:8");
	}